

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

boundaries __thiscall fmt::v7::detail::fp::assign_float_with_boundaries<double>(fp *this,double d)

{
  significand_type sVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  boundaries bVar8;
  
  this->f = (ulong)d & 0xfffffffffffff;
  uVar4 = (uint)((ulong)d >> 0x34) & 0x7ff;
  if (uVar4 == 0) {
    iVar5 = -0x432;
  }
  else {
    this->f = (ulong)d & 0xfffffffffffff | 0x10000000000000;
    iVar5 = uVar4 - 0x433;
  }
  uVar7 = 0x10000000L << (0x4eU - (char)iVar5 & 0x3f);
  if (-0xb3 < iVar5) {
    uVar7 = 0x10000000;
  }
  this->e = iVar5;
  sVar1 = this->f;
  uVar3 = uVar7 + sVar1;
  iVar6 = iVar5;
  if ((uVar3 & 0x10000000000000) == 0) {
    lVar2 = 0x3f;
    if ((uVar3 & 0xfffffffffffff) != 0) {
      for (; (uVar3 & 0xfffffffffffff) >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    uVar3 = uVar3 << (~(byte)lVar2 + 0x35 & 0x3f);
    iVar6 = (iVar5 - ((uint)lVar2 ^ 0x3f)) + 0xb;
  }
  bVar8.upper = uVar3 << 0xb;
  bVar8.lower = sVar1 - (uVar7 >> (-0xb2 < iVar5 && sVar1 == 0x10000000000000)) <<
                (((char)iVar5 - (char)iVar6) + 0xbU & 0x3f);
  return bVar8;
}

Assistant:

boundaries assign_float_with_boundaries(Double d) {
    assign(d);
    constexpr int min_normal_e = std::numeric_limits<float>::min_exponent -
                                 std::numeric_limits<double>::digits;
    significand_type half_ulp = 1 << (std::numeric_limits<double>::digits -
                                      std::numeric_limits<float>::digits - 1);
    if (min_normal_e > e) half_ulp <<= min_normal_e - e;
    fp upper = normalize<0>(fp(f + half_ulp, e));
    fp lower = fp(
        f - (half_ulp >> ((f == implicit_bit && e > min_normal_e) ? 1 : 0)), e);
    lower.f <<= lower.e - upper.e;
    return boundaries{lower.f, upper.f};
  }